

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void Gudhi::persistence_matrix::swap
               (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
                *matrix1,
               Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
               *matrix2)

{
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
  *matrix2_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
  *matrix1_local;
  
  swap(&matrix1->super_Matrix_dimension_option,&matrix2->super_Matrix_dimension_option);
  swap((Dummy_chain_pairing *)matrix1,(Dummy_chain_pairing *)matrix2);
  swap(&matrix1->super_Chain_vine_swap_option,&matrix2->super_Chain_vine_swap_option);
  swap(&matrix1->super_Chain_representative_cycles_option,
       &matrix2->super_Chain_representative_cycles_option);
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>_>_>
  ::swap(&matrix1->matrix_,&matrix2->matrix_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
            (&matrix1->pivotToColumnIndex_,&matrix2->pivotToColumnIndex_);
  std::swap<unsigned_int>(&matrix1->nextIndex_,&matrix2->nextIndex_);
  std::
  swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>::Column_z2_settings*>
            (&matrix1->colSettings_,&matrix2->colSettings_);
  swap(&matrix1->super_Matrix_row_access_option,&matrix2->super_Matrix_row_access_option);
  return;
}

Assistant:

void swap(Chain_matrix& matrix1, Chain_matrix& matrix2) {
    swap(static_cast<typename Master_matrix::Matrix_dimension_option&>(matrix1),
         static_cast<typename Master_matrix::Matrix_dimension_option&>(matrix2));
    swap(static_cast<typename Master_matrix::Chain_pairing_option&>(matrix1),
         static_cast<typename Master_matrix::Chain_pairing_option&>(matrix2));
    swap(static_cast<typename Master_matrix::Chain_vine_swap_option&>(matrix1),
         static_cast<typename Master_matrix::Chain_vine_swap_option&>(matrix2));
    swap(static_cast<typename Master_matrix::Chain_representative_cycles_option&>(matrix1),
         static_cast<typename Master_matrix::Chain_representative_cycles_option&>(matrix2));
    matrix1.matrix_.swap(matrix2.matrix_);
    matrix1.pivotToColumnIndex_.swap(matrix2.pivotToColumnIndex_);
    std::swap(matrix1.nextIndex_, matrix2.nextIndex_);
    std::swap(matrix1.colSettings_, matrix2.colSettings_);

    if constexpr (Master_matrix::Option_list::has_row_access) {
      swap(static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix1),
           static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix2));
    }
  }